

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

void __thiscall ccs::ast::BranchImpl::BranchImpl(BranchImpl *this,P *first,Traverse *traverse)

{
  Traverse *traverse_local;
  P *first_local;
  BranchImpl *this_local;
  
  SelectorBranch::SelectorBranch(&this->super_SelectorBranch);
  (this->super_SelectorBranch)._vptr_SelectorBranch = (_func_int **)&PTR__BranchImpl_00266420;
  std::shared_ptr<ccs::ast::SelectorLeaf>::shared_ptr(&this->first_,first);
  std::
  function<std::shared_ptr<ccs::BuildContext>_(ccs::ast::SelectorLeaf_&,_std::shared_ptr<ccs::BuildContext>,_std::shared_ptr<ccs::BuildContext>)>
  ::function(&this->traverse_,traverse);
  return;
}

Assistant:

BranchImpl(SelectorLeaf::P first, Traverse traverse) :
    first_(first), traverse_(traverse) {}